

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwidgets.cpp
# Opt level: O2

void do_pop_up_error_proc(Am_Object param_1)

{
  ostream *poVar1;
  ostrstream oss;
  char line [250];
  
  std::ostrstream::ostrstream(&oss,line,0xfa,_S_out);
  poVar1 = std::operator<<((ostream *)&oss,"This is an error message");
  std::ends<char,std::char_traits<char>>(poVar1);
  Am_Pop_Up_Error_Window(line);
  std::ostrstream::~ostrstream(&oss);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_pop_up_error, (Am_Object /*cmd*/))
{
  AM_POP_UP_ERROR_WINDOW("This is an error message");
}